

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalFileLog.cpp
# Opt level: O2

string * ApprovalFileLog::getLogFilePath_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,"./.approval_tests_temp",&local_51);
  std::operator+(&local_50,"",&local_30);
  std::operator+(in_RDI,&local_50,"/.approved_files.log");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_50,"./.approval_tests_temp",(allocator *)&local_30);
  ApprovalTests::SystemUtils::ensureDirectoryExists(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return in_RDI;
}

Assistant:

std::string ApprovalFileLog::getLogFilePath()
{
    //auto const rootDirectory = ApprovalTests::TestName::getRootDirectory();
    auto const rootDirectory = "";
    // Note: Need to figure out where the actual root directory is.
    std::string const filePath =
        rootDirectory + std::string(APPROVAL_TEMP_DIRECTORY) + "/.approved_files.log";
    ApprovalTests::SystemUtils::ensureDirectoryExists(APPROVAL_TEMP_DIRECTORY);
    return filePath;
}